

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

void __thiscall
google::protobuf::DescriptorBuilder::ValidateOptions
          (DescriptorBuilder *this,FieldDescriptor *field,FieldDescriptorProto *proto)

{
  DescriptorPool *this_00;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error_00;
  FieldDescriptorProto *field_00;
  bool bVar1;
  Edition EVar2;
  Type TVar3;
  int iVar4;
  int32_t iVar5;
  ExtensionRangeOptions_VerificationState EVar6;
  Descriptor *pDVar7;
  FileDescriptor *pFVar8;
  FieldOptions *pFVar9;
  FieldDescriptorProto *pFVar10;
  MessageOptions *this_01;
  ExtensionRange *pEVar11;
  RepeatedPtrField<google::protobuf::ExtensionRangeOptions_Declaration> *pRVar12;
  string *psVar13;
  char needle;
  FieldDescriptorProto *in_RCX;
  char *pcVar14;
  string_view sVar15;
  string_view haystack;
  bool local_1d2;
  bool local_1d1;
  anon_class_8_1_a7e8901a local_1c0;
  VoidPtr local_1b8;
  Invoker<std::__cxx11::basic_string<char>_> local_1b0;
  string_view local_1a8;
  string_view local_198;
  string_view local_188;
  anon_class_8_1_a7e8901a local_178;
  VoidPtr local_170;
  Invoker<std::__cxx11::basic_string<char>_> local_168;
  string_view local_160;
  reference local_150;
  ExtensionRangeOptions_Declaration *declaration;
  const_iterator __end4;
  const_iterator __begin4;
  RepeatedPtrField<google::protobuf::ExtensionRangeOptions_Declaration> *__range4;
  ExtensionRange *extension_range;
  lts_20250127 *local_108;
  char *local_100;
  bool local_e1;
  _anonymous_namespace_ *local_e0;
  char *local_d8;
  string local_d0;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_b0;
  string_view local_a0;
  string_view local_90;
  string_view local_80;
  string_view local_70;
  string_view local_60;
  string_view local_50;
  string_view local_40;
  string_view local_30;
  FieldDescriptorProto *local_20;
  FieldDescriptorProto *proto_local;
  FieldDescriptor *field_local;
  DescriptorBuilder *this_local;
  
  local_20 = proto;
  proto_local = (FieldDescriptorProto *)field;
  field_local = (FieldDescriptor *)this;
  if ((this->pool_->lazily_build_dependencies_ & 1U) != 0) {
    if (field == (FieldDescriptor *)0x0) {
      return;
    }
    pDVar7 = FieldDescriptor::message_type(field);
    if (pDVar7 == (Descriptor *)0x0) {
      return;
    }
  }
  ValidateFieldFeatures(this,(FieldDescriptor *)proto_local,local_20);
  pFVar8 = FieldDescriptor::file((FieldDescriptor *)proto_local);
  EVar2 = FileDescriptor::edition(pFVar8);
  if ((1000 < (int)EVar2) &&
     (bVar1 = FieldDescriptor::has_legacy_proto_ctype((FieldDescriptor *)proto_local), bVar1)) {
    local_30 = FieldDescriptor::full_name((FieldDescriptor *)proto_local);
    in_RCX = local_20;
    AddError(this,local_30,&local_20->super_Message,TYPE,
             "ctype option is not allowed under edition 2024 and beyond. Use the feature string_type = VIEW|CORD|STRING|... instead."
            );
  }
  pFVar9 = FieldDescriptor::options((FieldDescriptor *)proto_local);
  bVar1 = FieldOptions::lazy(pFVar9);
  if (!bVar1) {
    pFVar9 = FieldDescriptor::options((FieldDescriptor *)proto_local);
    bVar1 = FieldOptions::unverified_lazy(pFVar9);
    if (!bVar1) goto LAB_0020cc99;
  }
  TVar3 = FieldDescriptor::type((FieldDescriptor *)proto_local);
  if (TVar3 != TYPE_MESSAGE) {
    local_40 = FieldDescriptor::full_name((FieldDescriptor *)proto_local);
    in_RCX = local_20;
    AddError(this,local_40,&local_20->super_Message,TYPE,
             "[lazy = true] can only be specified for submessage fields.");
  }
LAB_0020cc99:
  pFVar9 = FieldDescriptor::options((FieldDescriptor *)proto_local);
  bVar1 = FieldOptions::packed(pFVar9);
  if ((bVar1) && (bVar1 = FieldDescriptor::is_packable((FieldDescriptor *)proto_local), !bVar1)) {
    local_50 = FieldDescriptor::full_name((FieldDescriptor *)proto_local);
    in_RCX = local_20;
    AddError(this,local_50,&local_20->super_Message,TYPE,
             "[packed = true] can only be specified for repeated primitive fields.");
  }
  if ((proto_local->field_0)._impl_.extendee_.tagged_ptr_.ptr_ != (void *)0x0) {
    pDVar7 = FieldDescriptor::containing_type((FieldDescriptor *)proto_local);
    pFVar10 = (FieldDescriptorProto *)Descriptor::options(pDVar7);
    in_RCX = (FieldDescriptorProto *)MessageOptions::default_instance();
    if (pFVar10 != in_RCX) {
      pDVar7 = FieldDescriptor::containing_type((FieldDescriptor *)proto_local);
      this_01 = Descriptor::options(pDVar7);
      bVar1 = MessageOptions::message_set_wire_format(this_01);
      if (bVar1) {
        bVar1 = FieldDescriptor::is_extension((FieldDescriptor *)proto_local);
        if (bVar1) {
          bVar1 = FieldDescriptor::is_required((FieldDescriptor *)proto_local);
          if (((bVar1) ||
              (bVar1 = FieldDescriptor::is_repeated((FieldDescriptor *)proto_local), bVar1)) ||
             (TVar3 = FieldDescriptor::type((FieldDescriptor *)proto_local), TVar3 != TYPE_MESSAGE))
          {
            local_60 = FieldDescriptor::full_name((FieldDescriptor *)proto_local);
            in_RCX = local_20;
            AddError(this,local_60,&local_20->super_Message,TYPE,
                     "Extensions of MessageSets must be optional messages.");
          }
        }
        else {
          local_70 = FieldDescriptor::full_name((FieldDescriptor *)proto_local);
          in_RCX = local_20;
          AddError(this,local_70,&local_20->super_Message,NAME,
                   "MessageSets cannot have fields, only extensions.");
        }
      }
    }
  }
  pFVar8 = FieldDescriptor::file((FieldDescriptor *)proto_local);
  bVar1 = IsLite(pFVar8);
  if ((bVar1) && ((proto_local->field_0)._impl_.extendee_.tagged_ptr_.ptr_ != (void *)0x0)) {
    pDVar7 = FieldDescriptor::containing_type((FieldDescriptor *)proto_local);
    pFVar8 = Descriptor::file(pDVar7);
    bVar1 = IsLite(pFVar8);
    if (!bVar1) {
      local_80 = FieldDescriptor::full_name((FieldDescriptor *)proto_local);
      in_RCX = local_20;
      AddError(this,local_80,&local_20->super_Message,EXTENDEE,
               "Extensions to non-lite types can only be declared in non-lite files.  Note that you cannot extend a non-lite type to contain a lite type, but the reverse is allowed."
              );
    }
  }
  bVar1 = FieldDescriptor::is_map((FieldDescriptor *)proto_local);
  if ((bVar1) && (bVar1 = ValidateMapEntry(this,(FieldDescriptor *)proto_local,local_20), !bVar1)) {
    local_90 = FieldDescriptor::full_name((FieldDescriptor *)proto_local);
    in_RCX = local_20;
    AddError(this,local_90,&local_20->super_Message,TYPE,
             "map_entry should not be set explicitly. Use map<KeyType, ValueType> instead.");
  }
  ValidateJSType(this,(FieldDescriptor *)proto_local,local_20);
  bVar1 = FieldDescriptor::is_extension((FieldDescriptor *)proto_local);
  pcVar14 = (char *)CONCAT71((int7)((ulong)in_RCX >> 8),bVar1);
  local_e1 = false;
  local_1d1 = false;
  if (bVar1) {
    local_e1 = FieldDescriptor::has_json_name((FieldDescriptor *)proto_local);
    pcVar14 = (char *)CONCAT71((int7)((ulong)pcVar14 >> 8),local_e1);
    local_1d2 = false;
    if (local_e1) {
      local_a0 = FieldDescriptor::json_name((FieldDescriptor *)proto_local);
      sVar15 = FieldDescriptor::name((FieldDescriptor *)proto_local);
      local_e0 = (_anonymous_namespace_ *)sVar15._M_len;
      local_d8 = sVar15._M_str;
      sVar15._M_str = pcVar14;
      sVar15._M_len = (size_t)local_d8;
      protobuf::(anonymous_namespace)::ToJsonName_abi_cxx11_(&local_d0,local_e0,sVar15);
      local_b0 = (__type_identity_t<basic_string_view<char,_char_traits<char>_>_>)
                 std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_d0);
      pcVar14 = local_b0._M_str;
      local_1d2 = std::operator!=(local_a0,local_b0);
    }
    local_1d1 = local_1d2;
  }
  needle = (char)pcVar14;
  if (local_e1 != false) {
    std::__cxx11::string::~string((string *)&local_d0);
  }
  if (local_1d1 != false) {
    sVar15 = FieldDescriptor::full_name((FieldDescriptor *)proto_local);
    pFVar10 = local_20;
    AddError(this,sVar15,&local_20->super_Message,OPTION_NAME,
             "option json_name is not allowed on extension fields.");
    needle = (char)pFVar10;
  }
  sVar15 = FieldDescriptor::json_name((FieldDescriptor *)proto_local);
  local_108 = (lts_20250127 *)sVar15._M_len;
  local_100 = sVar15._M_str;
  haystack._M_str = (char *)0x0;
  haystack._M_len = (size_t)local_100;
  bVar1 = absl::lts_20250127::StrContains(local_108,haystack,needle);
  if (bVar1) {
    sVar15 = FieldDescriptor::full_name((FieldDescriptor *)proto_local);
    AddError(this,sVar15,&local_20->super_Message,OPTION_NAME,
             "json_name cannot have embedded null characters.");
  }
  bVar1 = FieldDescriptor::is_extension((FieldDescriptor *)proto_local);
  if (bVar1) {
    this_00 = this->pool_;
    pDVar7 = FieldDescriptor::containing_type((FieldDescriptor *)proto_local);
    sVar15 = Descriptor::full_name(pDVar7);
    bVar1 = DescriptorPool::IsReadyForCheckingDescriptorExtDecl(this_00,sVar15);
    if (!bVar1) {
      pDVar7 = FieldDescriptor::containing_type((FieldDescriptor *)proto_local);
      iVar4 = FieldDescriptor::number((FieldDescriptor *)proto_local);
      pEVar11 = Descriptor::FindExtensionRangeContainingNumber(pDVar7,iVar4);
      if (pEVar11->options_ != (ExtensionRangeOptions *)0x0) {
        bVar1 = DescriptorPool::EnforceCustomExtensionDeclarations(this->pool_);
        if (bVar1) {
          pRVar12 = ExtensionRangeOptions::declaration(pEVar11->options_);
          __end4 = RepeatedPtrField<google::protobuf::ExtensionRangeOptions_Declaration>::begin
                             (pRVar12);
          declaration = (ExtensionRangeOptions_Declaration *)
                        RepeatedPtrField<google::protobuf::ExtensionRangeOptions_Declaration>::end
                                  (pRVar12);
          while( true ) {
            bVar1 = internal::operator!=(&__end4,(iterator *)&declaration);
            if (!bVar1) break;
            local_150 = internal::
                        RepeatedPtrIterator<const_google::protobuf::ExtensionRangeOptions_Declaration>
                        ::operator*(&__end4);
            iVar5 = ExtensionRangeOptions_Declaration::number(local_150);
            iVar4 = FieldDescriptor::number((FieldDescriptor *)proto_local);
            if (iVar5 == iVar4) {
              bVar1 = ExtensionRangeOptions_Declaration::reserved(local_150);
              field_00 = proto_local;
              pFVar10 = local_20;
              if (!bVar1) {
                psVar13 = ExtensionRangeOptions_Declaration::full_name_abi_cxx11_(local_150);
                local_188 = (string_view)
                            std::__cxx11::string::operator_cast_to_basic_string_view
                                      ((string *)psVar13);
                psVar13 = ExtensionRangeOptions_Declaration::type_abi_cxx11_(local_150);
                local_198 = (string_view)
                            std::__cxx11::string::operator_cast_to_basic_string_view
                                      ((string *)psVar13);
                bVar1 = ExtensionRangeOptions_Declaration::repeated(local_150);
                CheckExtensionDeclaration
                          (this,(FieldDescriptor *)field_00,pFVar10,local_188,local_198,bVar1);
                return;
              }
              local_160 = FieldDescriptor::full_name((FieldDescriptor *)proto_local);
              pFVar10 = local_20;
              local_178.field = (FieldDescriptor **)&proto_local;
              absl::lts_20250127::FunctionRef<std::__cxx11::string()>::
              FunctionRef<google::protobuf::DescriptorBuilder::ValidateOptions(google::protobuf::FieldDescriptor_const*,google::protobuf::FieldDescriptorProto_const&)::__0,void>
                        ((FunctionRef<std::__cxx11::string()> *)&local_170,&local_178);
              make_error.invoker_ = local_168;
              make_error.ptr_.obj = local_170.obj;
              AddError(this,local_160,&pFVar10->super_Message,EXTENDEE,make_error);
              return;
            }
            internal::RepeatedPtrIterator<const_google::protobuf::ExtensionRangeOptions_Declaration>
            ::operator++(&__end4);
          }
          pRVar12 = ExtensionRangeOptions::declaration(pEVar11->options_);
          bVar1 = RepeatedPtrField<google::protobuf::ExtensionRangeOptions_Declaration>::empty
                            (pRVar12);
          if (bVar1) {
            EVar6 = ExtensionRangeOptions::verification(pEVar11->options_);
            if (EVar6 != ExtensionRangeOptions_VerificationState_DECLARATION) {
              return;
            }
          }
          local_1a8 = FieldDescriptor::full_name((FieldDescriptor *)proto_local);
          pFVar10 = local_20;
          local_1c0.field = (FieldDescriptor **)&proto_local;
          absl::lts_20250127::FunctionRef<std::__cxx11::string()>::
          FunctionRef<google::protobuf::DescriptorBuilder::ValidateOptions(google::protobuf::FieldDescriptor_const*,google::protobuf::FieldDescriptorProto_const&)::__1,void>
                    ((FunctionRef<std::__cxx11::string()> *)&local_1b8,&local_1c0);
          make_error_00.invoker_ = local_1b0;
          make_error_00.ptr_.obj = local_1b8.obj;
          AddError(this,local_1a8,&pFVar10->super_Message,EXTENDEE,make_error_00);
        }
      }
    }
  }
  return;
}

Assistant:

void DescriptorBuilder::ValidateOptions(const FieldDescriptor* field,
                                        const FieldDescriptorProto& proto) {
  if (pool_->lazily_build_dependencies_ && (!field || !field->message_type())) {
    return;
  }

  ValidateFieldFeatures(field, proto);

  if (field->file()->edition() >= Edition::EDITION_2024 &&
      field->has_legacy_proto_ctype()) {
    AddError(field->full_name(), proto, DescriptorPool::ErrorCollector::TYPE,
             "ctype option is not allowed under edition 2024 and beyond. Use "
             "the feature string_type = VIEW|CORD|STRING|... instead.");
  }

  // Only message type fields may be lazy.
  if (field->options().lazy() || field->options().unverified_lazy()) {
    if (field->type() != FieldDescriptor::TYPE_MESSAGE) {
      AddError(field->full_name(), proto, DescriptorPool::ErrorCollector::TYPE,
               "[lazy = true] can only be specified for submessage fields.");
    }
  }

  // Only repeated primitive fields may be packed.
  if (field->options().packed() && !field->is_packable()) {
    AddError(
        field->full_name(), proto, DescriptorPool::ErrorCollector::TYPE,
        "[packed = true] can only be specified for repeated primitive fields.");
  }

  // Note:  Default instance may not yet be initialized here, so we have to
  //   avoid reading from it.
  if (field->containing_type_ != nullptr &&
      &field->containing_type()->options() !=
          &MessageOptions::default_instance() &&
      field->containing_type()->options().message_set_wire_format()) {
    if (field->is_extension()) {
      if ((field->is_required() || field->is_repeated()) ||
          field->type() != FieldDescriptor::TYPE_MESSAGE) {
        AddError(field->full_name(), proto,
                 DescriptorPool::ErrorCollector::TYPE,
                 "Extensions of MessageSets must be optional messages.");
      }
    } else {
      AddError(field->full_name(), proto, DescriptorPool::ErrorCollector::NAME,
               "MessageSets cannot have fields, only extensions.");
    }
  }

  // Lite extensions can only be of Lite types.
  if (IsLite(field->file()) && field->containing_type_ != nullptr &&
      !IsLite(field->containing_type()->file())) {
    AddError(field->full_name(), proto,
             DescriptorPool::ErrorCollector::EXTENDEE,
             "Extensions to non-lite types can only be declared in non-lite "
             "files.  Note that you cannot extend a non-lite type to contain "
             "a lite type, but the reverse is allowed.");
  }

  // Validate map types.
  if (field->is_map()) {
    if (!ValidateMapEntry(field, proto)) {
      AddError(field->full_name(), proto, DescriptorPool::ErrorCollector::TYPE,
               "map_entry should not be set explicitly. Use map<KeyType, "
               "ValueType> instead.");
    }
  }

  ValidateJSType(field, proto);

  // json_name option is not allowed on extension fields. Note that the
  // json_name field in FieldDescriptorProto is always populated by protoc
  // when it sends descriptor data to plugins (calculated from field name if
  // the option is not explicitly set) so we can't rely on its presence to
  // determine whether the json_name option is set on the field. Here we
  // compare it against the default calculated json_name value and consider
  // the option set if they are different. This won't catch the case when
  // a user explicitly sets json_name to the default value, but should be
  // good enough to catch common misuses.
  if (field->is_extension() &&
      (field->has_json_name() &&
       field->json_name() != ToJsonName(field->name()))) {
    AddError(field->full_name(), proto,
             DescriptorPool::ErrorCollector::OPTION_NAME,
             "option json_name is not allowed on extension fields.");
  }

  if (absl::StrContains(field->json_name(), '\0')) {
    AddError(field->full_name(), proto,
             DescriptorPool::ErrorCollector::OPTION_NAME,
             "json_name cannot have embedded null characters.");
  }


  // If this is a declared extension, validate that the actual name and type
  // match the declaration.
  if (field->is_extension()) {
    if (pool_->IsReadyForCheckingDescriptorExtDecl(
            field->containing_type()->full_name())) {
      return;
    }
    const Descriptor::ExtensionRange* extension_range =
        field->containing_type()->FindExtensionRangeContainingNumber(
            field->number());

    if (extension_range->options_ == nullptr) {
      return;
    }

    if (pool_->EnforceCustomExtensionDeclarations()) {
      for (const auto& declaration : extension_range->options_->declaration()) {
        if (declaration.number() != field->number()) continue;
        if (declaration.reserved()) {
          AddError(
              field->full_name(), proto,
              DescriptorPool::ErrorCollector::EXTENDEE, [&] {
                return absl::Substitute(
                    "Cannot use number $0 for extension field $1, as it is "
                    "reserved in the extension declarations for message $2.",
                    field->number(), field->full_name(),
                    field->containing_type()->full_name());
              });
          return;
        }
        CheckExtensionDeclaration(*field, proto, declaration.full_name(),
                                  declaration.type(), declaration.repeated());
        return;
      }

      // Either no declarations, or there are but no matches. If there are no
      // declarations, we check its verification state. If there are other
      // non-matching declarations, we enforce that this extension must also be
      // declared.
      if (!extension_range->options_->declaration().empty() ||
          (extension_range->options_->verification() ==
           ExtensionRangeOptions::DECLARATION)) {
        AddError(
            field->full_name(), proto, DescriptorPool::ErrorCollector::EXTENDEE,
            [&] {
              return absl::Substitute(
                  "Missing extension declaration for field $0 with number $1 "
                  "in extendee message $2. An extension range must declare for "
                  "all extension fields if its verification state is "
                  "DECLARATION or there's any declaration in the range "
                  "already. Otherwise, consider splitting up the range.",
                  field->full_name(), field->number(),
                  field->containing_type()->full_name());
            });
        return;
      }
    }
  }
}